

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle_builtin
          (ActiveBuiltinHandler *this,SPIRType *type,BuiltIn builtin,Bitset *decoration_flags)

{
  uint uVar1;
  runtime_error *prVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (builtin == BuiltInPosition) {
    if ((decoration_flags->lower & 0x40000) != 0) {
      this->compiler->position_invariant = true;
    }
  }
  else if (builtin == BuiltInCullDistance) {
    if (*(type->array_size_literal).super_VectorView<bool>.ptr == false) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Array size for CullDistance must be a literal.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = *(type->array).super_VectorView<unsigned_int>.ptr;
    if (uVar1 == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Array size for CullDistance must not be unsized.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->compiler->cull_distance_count = uVar1;
  }
  else if (builtin == BuiltInClipDistance) {
    if (*(type->array_size_literal).super_VectorView<bool>.ptr == false) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Array size for ClipDistance must be a literal.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = *(type->array).super_VectorView<unsigned_int>.ptr;
    if (uVar1 == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Array size for ClipDistance must not be unsized.","");
      ::std::runtime_error::runtime_error(prVar2,(string *)local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->compiler->clip_distance_count = uVar1;
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::handle_builtin(const SPIRType &type, BuiltIn builtin,
                                                    const Bitset &decoration_flags)
{
	// If used, we will need to explicitly declare a new array size for these builtins.

	if (builtin == BuiltInClipDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for ClipDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for ClipDistance must not be unsized.");
		compiler.clip_distance_count = array_size;
	}
	else if (builtin == BuiltInCullDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for CullDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for CullDistance must not be unsized.");
		compiler.cull_distance_count = array_size;
	}
	else if (builtin == BuiltInPosition)
	{
		if (decoration_flags.get(DecorationInvariant))
			compiler.position_invariant = true;
	}
}